

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ostream *poVar10;
  char **in_RSI;
  int in_EDI;
  bool bVar11;
  bool bVar12;
  int RtCod;
  HDual solver;
  int RtCd;
  HModel model;
  HTester tester;
  double TimeLimit_ArgV;
  char *partitionFile;
  char *crashMode;
  char *edWtMode;
  char *presolveMode;
  char *fileName;
  double cut;
  int timeLimit;
  int scip;
  int sip;
  int pami;
  int edgeWeight;
  int crash;
  int presolve;
  int filename;
  int opt;
  HTester *in_stack_fffffffffffe90a0;
  HModel *pHVar13;
  uint in_stack_fffffffffffe90b4;
  HTester *in_stack_fffffffffffe90d0;
  HDual *in_stack_fffffffffffe9110;
  char *in_stack_fffffffffffea268;
  undefined4 local_2418 [4];
  undefined4 local_2408;
  double local_23d8;
  char *in_stack_ffffffffffffed60;
  char *in_stack_ffffffffffffed68;
  char local_1278 [1360];
  char *in_stack_fffffffffffff2d8;
  double in_stack_fffffffffffff770;
  char *in_stack_fffffffffffff778;
  char *in_stack_fffffffffffff780;
  char *in_stack_fffffffffffff788;
  char *in_stack_fffffffffffff790;
  char *local_68;
  double local_40;
  int local_4;
  
  local_4 = 0;
  bVar12 = false;
  bVar11 = false;
  bVar1 = false;
  bVar2 = false;
  bVar5 = false;
  bVar3 = false;
  bVar4 = false;
  bVar6 = false;
  local_40 = 0.0;
  local_68 = (char *)0x0;
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "===================================================================================="
                           );
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Running hsol");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  if ((in_EDI == 4) && (iVar7 = strcmp(in_RSI[1],"-repeat"), iVar7 == 0)) {
    HTester::HTester(in_stack_fffffffffffe90d0);
    HTester::setup(local_1278);
    atoi(in_RSI[3]);
    HTester::testUpdate((int)local_1278);
    HTester::~HTester(in_stack_fffffffffffe90a0);
  }
  else {
    while (iVar7 = getopt(in_EDI,in_RSI,"p:c:e:sSm::t:T:df:"), iVar7 != -1) {
      switch(iVar7) {
      case 0x3f:
        if (iVar7 == 0x70) {
          fprintf(_stderr,"Option -%c requires an argument. Current options: Off On \n",0x70);
        }
        if (iVar7 == 99) {
          fprintf(_stderr,
                  "Option -%c requires an argument. Current options: Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 \n"
                  ,99);
        }
        if (iVar7 == 0x65) {
          fprintf(_stderr,
                  "Option -%c requires an argument. Current options: Dan Dvx DSE DSE0 DSE1 \n",0x65)
          ;
        }
        else {
          fprintf(_stderr,"usage: %s [options] -f fName.mps \n%s",*in_RSI,
                  "Options: \n  -p On(Off): use presolve\n  -c mode   : set crash mode to mode. Values:\n            : Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 LTSSF7\n  -e edWt   : set edge weight to edWt. Values: \n            : Dan Dvx DSE DSE0 DSE1\n\n  -s        : use option sip\n  -S        : use option SCIP (to test utilities)\n  -m [cut]  : use pami. Cutoff optional double value.\n  -t fName  : use pami with partition file fName  -T time   : use a time limit  -d        : debug mode on\n"
                 );
        }
      default:
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        abort();
      case 0x53:
        bVar4 = true;
        break;
      case 0x54:
        bVar6 = true;
        atof(_optarg);
        poVar10 = std::operator<<((ostream *)&std::cout,"Time limit is set to ");
        poVar10 = std::operator<<(poVar10,_optarg);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        break;
      case 99:
        bVar1 = true;
        poVar10 = std::operator<<((ostream *)&std::cout,"Crash is set to ");
        poVar10 = std::operator<<(poVar10,_optarg);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        break;
      case 100:
        debug = 1;
        break;
      case 0x65:
        bVar2 = true;
        poVar10 = std::operator<<((ostream *)&std::cout,"Edge weight is set to ");
        poVar10 = std::operator<<(poVar10,_optarg);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        break;
      case 0x66:
        bVar12 = true;
        poVar10 = std::operator<<((ostream *)&std::cout,"Reading file ");
        poVar10 = std::operator<<(poVar10,_optarg);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        break;
      case 0x6d:
        bVar5 = true;
        if (_optarg != (char *)0x0) {
          local_40 = atof(_optarg);
          poVar10 = std::operator<<((ostream *)&std::cout,"Pami cutoff = ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_40);
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        }
        break;
      case 0x70:
        uVar9 = in_stack_fffffffffffe90b4 & 0xffffff;
        if (*_optarg == 'O') {
          uVar9 = CONCAT13(_optarg[1] == 'n',(int3)in_stack_fffffffffffe90b4);
        }
        bVar11 = (char)(uVar9 >> 0x18) != '\0';
        poVar10 = std::operator<<((ostream *)&std::cout,"Presolve is set to ");
        poVar10 = std::operator<<(poVar10,_optarg);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        in_stack_fffffffffffe90b4 = uVar9;
        break;
      case 0x73:
        bVar3 = true;
        break;
      case 0x74:
        local_68 = _optarg;
        poVar10 = std::operator<<((ostream *)&std::cout,"Partition file is set to ");
        poVar10 = std::operator<<(poVar10,_optarg);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
    }
    if (!bVar12) {
      printf("Setting default value filenameMode = %s\n","ml.mps");
    }
    if (!bVar11) {
      printf("Setting default value presolveMode = %s\n","Off");
    }
    if (!bVar1) {
      printf("Setting default value crashMode = %s\n","Off");
    }
    if (!bVar2) {
      printf("Setting default value edWtMode = %s\n","DSE1");
    }
    if (bVar3) {
      solveTasks(in_stack_ffffffffffffed68);
    }
    if (bVar4) {
      solveSCIP(in_stack_fffffffffffff2d8);
    }
    else if (bVar5) {
      if (local_68 == (char *)0x0) {
        if ((local_40 != 0.0) || (NAN(local_40))) {
          HModel::HModel((HModel *)local_2418);
          local_2418[0] = 1;
          local_2408 = 1;
          local_23d8 = local_40;
          iVar8 = HModel::load_fromMPS((char *)local_2418);
          bVar12 = iVar8 == 0;
          iVar7 = iVar8;
          if (bVar12) {
            HModel::scaleModel();
            pHVar13 = (HModel *)&stack0xfffffffffffe90d0;
            HDual::HDual(in_stack_fffffffffffe9110);
            HDual::solve(pHVar13,(int)local_2418,2);
            HModel::util_reportSolverOutcome((char *)local_2418);
            HDual::~HDual(in_stack_fffffffffffe9110);
            iVar7 = local_4;
          }
          local_4 = iVar7;
          HModel::~HModel((HModel *)CONCAT44(in_stack_fffffffffffe90b4,iVar8));
          if (!bVar12) {
            return local_4;
          }
        }
        else {
          solveMulti(in_stack_ffffffffffffed68,in_stack_ffffffffffffed60);
        }
      }
      else {
        solveMulti(in_stack_ffffffffffffed68,in_stack_ffffffffffffed60);
      }
    }
    else if ((((bVar11) || (bVar1)) || (bVar2)) || (bVar6)) {
      if (((!bVar11) || (bVar1)) || ((bVar2 || (bVar6)))) {
        solvePlainJAJH(in_stack_fffffffffffff790,in_stack_fffffffffffff788,in_stack_fffffffffffff780
                       ,in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      }
      else {
        solvePlainWithPresolve(in_stack_fffffffffffea268);
      }
    }
    else {
      uVar9 = solvePlain(in_stack_ffffffffffffed68);
      if (uVar9 != 0) {
        printf("solvePlain(API) return code is %d\n",(ulong)uVar9);
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  int opt, filename=0, presolve=0, crash=0, edgeWeight=0, pami=0, sip=0, scip=0, timeLimit=0;
	double cut = 0;
	const char * fileName = "";
	const char * presolveMode = "";
	const char * edWtMode = "";
	const char * crashMode= "";
	const char * partitionFile = 0;
	double TimeLimit_ArgV = HSOL_CONST_INF;

#ifdef JAJH_dev
	cout <<"===================================================================================="<<endl;
	cout <<"Running hsol"<<endl;
#else
	cout <<"===================================================================================="<<endl;
	cout <<"Running hsol"<<endl;
#endif

	if (argc == 4 && strcmp(argv[1], "-repeat")==0) {
#ifdef JAJH_dev
	  HTester tester;
	  tester.setup(argv[2]);
	  tester.testUpdate(atoi(argv[3]));
#endif
	  return 0;
        }
	
	while ((opt = getopt(argc,argv,"p:c:e:sSm::t:T:df:")) != EOF)
	  switch(opt)
	    {
	    case 'f':
	      filename = 1;
	      cout <<"Reading file "<< optarg <<endl;
	      fileName = optarg;
	      break;
	    case 'p':
	      presolveMode = optarg;
	      presolve = (presolveMode[0]=='O' && presolveMode[1]=='n') ? 1 : 0;
	      cout <<"Presolve is set to "<< optarg <<endl;
	      break;
	    case 's':
	      sip = 1;
	      break;
	    case 'S':
	      scip = 1;
	      break;
	    case 'm':
	      pami = 1;
	      if (optarg) {
		cut = atof(optarg);
		cout<< "Pami cutoff = "<< cut<<endl;
	      }
	      break;
	    case 'd':
	      debug = 1;
	      break;
            case 'c':
	      crash = 1;
	      crashMode = optarg;
	      cout <<"Crash is set to "<< optarg <<endl;
	      break;
            case 'e':
	      edgeWeight = 1;
	      edWtMode = optarg;
	      cout <<"Edge weight is set to "<< optarg <<endl;
	      break;
	    case 't':
	      partitionFile = optarg;
	      cout <<"Partition file is set to "<< optarg <<endl;
	      break;
	    case 'T':
	      timeLimit = 1;
	      TimeLimit_ArgV = atof(optarg);
	      cout <<"Time limit is set to "<< optarg <<endl;
	      break;
            case '?':
	      if (opt == 'p')
		fprintf (stderr, "Option -%c requires an argument. Current options: Off On \n", opt);
	      if (opt == 'c')
		fprintf (stderr, "Option -%c requires an argument. Current options: Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 \n", opt);
	      if (opt == 'e')
		fprintf (stderr, "Option -%c requires an argument. Current options: Dan Dvx DSE DSE0 DSE1 \n", opt);
	      else
		fprintf(stderr, "usage: %s [options] -f fName.mps \n%s", argv[0],
			"Options: \n"
			"  -p On(Off): use presolve\n"
			"  -c mode   : set crash mode to mode. Values:\n"
			"            : Off LTSSF LTSSF1 LTSSF2 LTSSF3 LTSSF4 LTSSF5 LTSSF6 LTSSF7\n"
			"  -e edWt   : set edge weight to edWt. Values: \n"
			"            : Dan Dvx DSE DSE0 DSE1\n\n"
			"  -s        : use option sip\n"
			"  -S        : use option SCIP (to test utilities)\n"
			"  -m [cut]  : use pami. Cutoff optional double value.\n"
			"  -t fName  : use pami with partition file fName"
			"  -T time   : use a time limit"
			"  -d        : debug mode on\n");
	    default:
	      cout<<endl;
	      abort();
	    }
	//Set defaults
     if (!filename) {
       fileName = "ml.mps";
       printf("Setting default value filenameMode = %s\n", fileName);
     }
     if (!presolve) {
       presolveMode = "Off";
       printf("Setting default value presolveMode = %s\n", presolveMode);
     }
     if (!crash) {
       crashMode = "Off";
       printf("Setting default value crashMode = %s\n", crashMode);
     }
     if (!edgeWeight) {
       edWtMode = "DSE1";
       printf("Setting default value edWtMode = %s\n", edWtMode);
     }
    //parallel
    if (sip)
      solveTasks(fileName);
    if (scip)
      solveSCIP(fileName);
    else if (pami) {
    	if (partitionFile)
    		solveMulti(fileName, partitionFile);
    	else if (cut) {
            HModel model;
            model.intOption[INTOPT_PRINT_FLAG] = 1;
            model.intOption[INTOPT_PERMUTE_FLAG] = 1;
            model.dblOption[DBLOPT_PAMI_CUTOFF] = cut;
	    int RtCd = model.load_fromMPS(fileName);
	    if (RtCd) return RtCd;

	    model.scaleModel();
            HDual solver;
            solver.solve(&model, HDUAL_VARIANT_MULTI, 8);

            model.util_reportSolverOutcome("Cut");
        }
    	else
			solveMulti(fileName);
    }
    //serial
    else {
      if (!presolve && !crash && !edgeWeight && !timeLimit) {
	int RtCod = 
	//solvePlainAPI(fileName);
			solvePlain(fileName);
	if (RtCod != 0) {
	  printf("solvePlain(API) return code is %d\n", RtCod);
	}
      }
      else if (presolve && !crash && !edgeWeight && !timeLimit) {
	solvePlainWithPresolve(fileName);
	//solvePlainExperiments(fileName);
	//testIO("fileIO");
      }
      else
	solvePlainJAJH(edWtMode, crashMode, presolveMode, fileName, TimeLimit_ArgV);
    }

    return 0;
}